

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O2

int anon_unknown.dwarf_7353::RtMidi_getcompiledapibyname(lua_State *L)

{
  Api AVar1;
  long lVar2;
  string local_38;
  size_t sz;
  
  lVar2 = luaL_checklstring(L,1,&sz);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,lVar2,sz + lVar2);
  AVar1 = RtMidi::getCompiledApiByName(&local_38);
  lua_pushinteger(L,AVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return 1;
}

Assistant:

int RtMidi_getcompiledapibyname(lua_State *L) {
	std::size_t sz;
	const char *str = luaL_checklstring(L, 1, &sz);
	lua_pushinteger(L, RtMidi::getCompiledApiByName({str, sz}));
	return 1;
}